

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_scalar_equality(void)

{
  bool bVar1;
  undefined1 local_4e8 [8];
  json dt3;
  json dt2;
  json dt1;
  json j_string3;
  json j_string2;
  json j_string1;
  json j_double3;
  json j_double2;
  json j_double1;
  json j_int3;
  json j_int2;
  json j_int1;
  undefined1 local_b8 [8];
  json j_null2;
  json j_null1;
  
  std::operator<<((ostream *)jlog,"test_scalar_equality()\n");
  argo::json::json((json *)&j_null2.field_0x50);
  argo::json::json((json *)local_b8);
  bVar1 = argo::json::operator==((json *)&j_null2.field_0x50,(json *)local_b8);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: null pass\n");
  }
  bVar1 = argo::json::operator!=((json *)&j_null2.field_0x50,(json *)local_b8);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: null fail\n");
  }
  argo::json::json((json *)&j_int2.field_0x50,100);
  argo::json::json((json *)&j_int3.field_0x50,100);
  argo::json::json((json *)&j_double1.field_0x50,200);
  bVar1 = argo::json::operator==((json *)&j_int2.field_0x50,(json *)&j_int3.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: int pass\n");
  }
  bVar1 = argo::json::operator==((json *)&j_int2.field_0x50,(json *)&j_double1.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: int fail\n");
  }
  bVar1 = argo::json::operator!=((json *)&j_int2.field_0x50,(json *)&j_int3.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: int fail\n");
  }
  argo::json::json((json *)&j_double2.field_0x50,100.1);
  argo::json::json((json *)&j_double3.field_0x50,100.1);
  argo::json::json((json *)&j_string1.field_0x50,200.1);
  bVar1 = argo::json::operator==((json *)&j_double2.field_0x50,(json *)&j_double3.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: double pass\n");
  }
  bVar1 = argo::json::operator==((json *)&j_double2.field_0x50,(json *)&j_string1.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: double fail\n");
  }
  bVar1 = argo::json::operator!=((json *)&j_double2.field_0x50,(json *)&j_double3.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: double fail\n");
  }
  argo::json::json((json *)&j_string2.field_0x50,"asdf");
  argo::json::json((json *)&j_string3.field_0x50,"asdf");
  argo::json::json((json *)&dt1.field_0x50,"dfoiuoiuoiusdf");
  bVar1 = argo::json::operator==((json *)&j_string2.field_0x50,(json *)&j_string3.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: string pass\n");
  }
  bVar1 = argo::json::operator==((json *)&j_string2.field_0x50,(json *)&dt1.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: string fail\n");
  }
  bVar1 = argo::json::operator!=((json *)&j_string2.field_0x50,(json *)&j_string3.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: string fail\n");
  }
  argo::json::json((json *)&dt2.field_0x50,1);
  argo::json::json((json *)&dt3.field_0x50,1.0);
  argo::json::json((json *)local_4e8,true);
  bVar1 = argo::json::operator==((json *)&dt2.field_0x50,(json *)&dt3.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: int/double pass\n");
  }
  bVar1 = argo::json::operator==((json *)&dt3.field_0x50,(json *)&dt2.field_0x50);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: double/int pass\n");
  }
  bVar1 = argo::json::operator!=((json *)&dt2.field_0x50,(json *)local_4e8);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: missmatched types pass\n");
  }
  argo::json::~json((json *)local_4e8);
  argo::json::~json((json *)&dt3.field_0x50);
  argo::json::~json((json *)&dt2.field_0x50);
  argo::json::~json((json *)&dt1.field_0x50);
  argo::json::~json((json *)&j_string3.field_0x50);
  argo::json::~json((json *)&j_string2.field_0x50);
  argo::json::~json((json *)&j_string1.field_0x50);
  argo::json::~json((json *)&j_double3.field_0x50);
  argo::json::~json((json *)&j_double2.field_0x50);
  argo::json::~json((json *)&j_double1.field_0x50);
  argo::json::~json((json *)&j_int3.field_0x50);
  argo::json::~json((json *)&j_int2.field_0x50);
  argo::json::~json((json *)local_b8);
  argo::json::~json((json *)&j_null2.field_0x50);
  return;
}

Assistant:

void test_scalar_equality()
{
    jlog << "test_scalar_equality()\n";

    json j_null1;
    json j_null2;

    if (j_null1 == j_null2)
    {
        jlog << "PASS: null pass\n";
    }
    if (j_null1 != j_null2)
    {
        jlog << "FAIL: null fail\n";
    }

    json j_int1(100);
    json j_int2(100);
    json j_int3(200);

    if (j_int1 == j_int2)
    {
        jlog << "PASS: int pass\n";
    }
    if (j_int1 == j_int3)
    {
        jlog << "FAIL: int fail\n";
    }
    if (j_int1 != j_int2)
    {
        jlog << "FAIL: int fail\n";
    }

    json j_double1(100.1);
    json j_double2(100.1);
    json j_double3(200.1);

    if (j_double1 == j_double2)
    {
        jlog << "PASS: double pass\n";
    }
    if (j_double1 == j_double3)
    {
        jlog << "FAIL: double fail\n";
    }
    if (j_double1 != j_double2)
    {
        jlog << "FAIL: double fail\n";
    }

    json j_string1("asdf");
    json j_string2("asdf");
    json j_string3("dfoiuoiuoiusdf");

    if (j_string1 == j_string2)
    {
        jlog << "PASS: string pass\n";
    }
    if (j_string1 == j_string3)
    {
        jlog << "FAIL: string fail\n";
    }
    if (j_string1 != j_string2)
    {
        jlog << "FAIL: string fail\n";
    }

    json dt1(1);
    json dt2(1.0);
    json dt3(true);

    if (dt1 == dt2)
    {
        jlog << "PASS: int/double pass\n";
    }

    if (dt2 == dt1)
    {
        jlog << "PASS: double/int pass\n";
    }

    if (dt1 != dt3)
    {
        jlog << "PASS: missmatched types pass\n";
    }
}